

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O2

int __thiscall
vkt::pipeline::multisample::
MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleDistinctValues>::init
          (MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleDistinctValues> *this,
          EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_190;
  
  local_190.m_log =
       ((this->super_MultisampleCaseBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = &local_190.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Verifying that a interpolateAtSample returns different values for different samples.\n"
                 );
  std::operator<<((ostream *)this_00,
                  "\tRender full screen traingle with quadratic function defining red/green color pattern division.\n"
                 );
  std::operator<<((ostream *)this_00,
                  "\t=> Resulting image should contain n+1 different colors, where n = sample count.\n"
                 );
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar1 = tcu::TestNode::init((TestNode *)this,ctx_00);
  return iVar1;
}

Assistant:

void MSCase<MSCaseInterpolateAtSampleDistinctValues>::init (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that a interpolateAtSample returns different values for different samples.\n"
		<< "	Render full screen traingle with quadratic function defining red/green color pattern division.\n"
		<< "	=> Resulting image should contain n+1 different colors, where n = sample count.\n"
		<< tcu::TestLog::EndMessage;

	MultisampleCaseBase::init();
}